

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

FSerializer * Serialize(FSerializer *arc,char *key,DObject **value,DObject **param_4,bool *retcode)

{
  ushort uVar1;
  uint uVar2;
  FWriter *this;
  PClass *pPVar3;
  Value *pVVar4;
  Node *pNVar5;
  ClassReg *pCVar6;
  Node *pNVar7;
  int ndx;
  uint local_2c;
  
  if (retcode != (bool *)0x0) {
    *retcode = true;
  }
  this = arc->w;
  if (this != (FWriter *)0x0) {
    pPVar3 = (PClass *)*value;
    if (pPVar3 == (PClass *)0x0) {
      uVar2 = (this->mInObject).Count;
      if ((uVar2 != 0) && ((this->mInObject).Array[uVar2 - 1] != false)) {
        return arc;
      }
      FWriter::Null(this);
      return arc;
    }
    if (pPVar3 == AWeapon::RegistrationInfo.MyClass) {
      local_2c = 0xffffffff;
    }
    else {
      if ((*(ushort *)
            ((long)&(pPVar3->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType
                    .super_PType.super_PTypeBase.super_DObject + 0x20) & 0x820) != 0) {
        return arc;
      }
      pNVar5 = (this->mObjectMap).Nodes + ((this->mObjectMap).Size - 1 & (uint)pPVar3);
      do {
        pNVar7 = pNVar5;
        if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) {
          pNVar7 = (Node *)0x0;
          break;
        }
        pNVar5 = pNVar7->Next;
      } while ((PClass *)(pNVar7->Pair).Key != pPVar3);
      if (pNVar7 == (Node *)0x0) {
        TArray<DObject_*,_DObject_*>::Grow(&this->mDObjects,1);
        uVar2 = (this->mDObjects).Count;
        (this->mDObjects).Array[uVar2] = *value;
        (this->mDObjects).Count = uVar2 + 1;
        local_2c = uVar2;
        pNVar5 = TMap<DObject_*,_int,_THashTraits<DObject_*>,_TValueTraits<int>_>::GetNode
                           (&arc->w->mObjectMap,*value);
        (pNVar5->Pair).Value = uVar2;
      }
      else {
        local_2c = (pNVar7->Pair).Value;
      }
    }
    Serialize(arc,key,(int32_t *)&local_2c,(int32_t *)0x0);
    return arc;
  }
  if (arc->r->mObjectsRead == false) {
    __assert_fail("false && \"Attempt to read object reference without calling ReadObjects first\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                  ,0x657,
                  "FSerializer &Serialize(FSerializer &, const char *, DObject *&, DObject **, bool *)"
                 );
  }
  pVVar4 = FReader::FindKey(arc->r,key);
  if (pVVar4 != (Value *)0x0) {
    uVar1 = (pVVar4->data_).f.flags;
    if (uVar1 == 0) goto LAB_0047b6ce;
    if ((uVar1 & 0x20) != 0) {
      uVar2 = (pVVar4->data_).s.length;
      if ((ulong)uVar2 == 0xffffffff) {
        pCVar6 = &AWeapon::RegistrationInfo;
      }
      else {
        if (((int)uVar2 < 0) || ((int)(arc->r->mDObjects).Count <= (int)uVar2)) {
          __assert_fail("index >= 0 && index < (int)arc.r->mDObjects.Size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x66b,
                        "FSerializer &Serialize(FSerializer &, const char *, DObject *&, DObject **, bool *)"
                       );
        }
        pCVar6 = (ClassReg *)((arc->r->mDObjects).Array + uVar2);
      }
      *value = (DObject *)pCVar6->MyClass;
      return arc;
    }
  }
  if (retcode != (bool *)0x0) {
    *retcode = false;
    return arc;
  }
LAB_0047b6ce:
  *value = (DObject *)0x0;
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, DObject *&value, DObject ** /*defval*/, bool *retcode)
{
	if (retcode) *retcode = true;
	if (arc.isWriting())
	{
		if (value != nullptr)
		{
			int ndx;
			if (value == WP_NOCHANGE)
			{
				ndx = -1;
			}
			else if (value->ObjectFlags & (OF_EuthanizeMe | OF_Transient))
			{
				return arc;
			}
			else
			{
				int *pndx = arc.w->mObjectMap.CheckKey(value);
				if (pndx != nullptr)
				{
					ndx = *pndx;
				}
				else
				{
					ndx = arc.w->mDObjects.Push(value);
					arc.w->mObjectMap[value] = ndx;
				}
			}
			Serialize(arc, key, ndx, nullptr);
		}
		else if (!arc.w->inObject())
		{
			arc.w->Null();
		}
	}
	else
	{
		if (!arc.r->mObjectsRead)
		{
			// If you want to read objects, you MUST call ReadObjects first, even if there's only nullptr's.
			assert(false && "Attempt to read object reference without calling ReadObjects first");
			I_Error("Attempt to read object reference without calling ReadObjects first");
		}
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsNull())
			{
				value = nullptr;
				return arc;
			}
			else if (val->IsInt())
			{
				int index = val->GetInt();
				if (index == -1)
				{
					value = WP_NOCHANGE;
				}
				else
				{
					assert(index >= 0 && index < (int)arc.r->mDObjects.Size());
					if (index >= 0 && index < (int)arc.r->mDObjects.Size())
					{
						value = arc.r->mDObjects[index];
					}
					else
					{
						assert(false && "invalid object reference");
						Printf(TEXTCOLOR_RED "Invalid object reference for '%s'", key);
						value = nullptr;
						arc.mErrors++;
						if (retcode) *retcode = false;
					}
				}
				return arc;
			}
		}
		if (!retcode)
		{
			value = nullptr;
		}
		else
		{
			*retcode = false;
		}
	}
	return arc;
}